

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O3

int read_markers(j_decompress_ptr cinfo)

{
  byte bVar1;
  byte bVar2;
  JOCTET JVar3;
  JOCTET JVar4;
  byte bVar5;
  jpeg_source_mgr *pjVar6;
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  undefined1 auVar16 [13];
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  undefined1 auVar20 [13];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [13];
  undefined1 auVar24 [13];
  boolean bVar25;
  int iVar26;
  uint uVar27;
  jpeg_error_mgr *pjVar28;
  jpeg_marker_reader *pjVar29;
  JHUFF_TBL *pJVar30;
  JQUANT_TBL *pJVar31;
  JHUFF_TBL **ppJVar32;
  ulong uVar33;
  ulong uVar34;
  byte *pbVar35;
  boolean is_prog;
  size_t sVar36;
  JOCTET *pJVar37;
  UINT16 UVar38;
  byte *pbVar39;
  uint uVar40;
  long lVar41;
  jpeg_component_info *pjVar42;
  long lVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  UINT8 bits [17];
  size_t local_198;
  byte local_178;
  uint uStack_177;
  undefined3 uStack_173;
  undefined1 uStack_170;
  uint uStack_16f;
  undefined3 uStack_16b;
  UINT8 UStack_168;
  UINT8 *local_158;
  UINT8 *local_150;
  JHUFF_TBL **local_148;
  JHUFF_TBL **local_140;
  byte local_138 [264];
  
  local_140 = cinfo->ac_huff_tbl_ptrs;
  local_148 = cinfo->dc_huff_tbl_ptrs;
  local_150 = cinfo->arith_dc_L;
  local_158 = cinfo->arith_dc_U;
  uVar40 = cinfo->unread_marker;
  do {
    if (uVar40 == 0) {
      if (cinfo->marker->saw_SOI == 0) {
        pjVar6 = cinfo->src;
        sVar36 = pjVar6->bytes_in_buffer;
        if (sVar36 == 0) {
          bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
          if (bVar25 == 0) goto LAB_001231d5;
          sVar36 = pjVar6->bytes_in_buffer;
        }
        bVar1 = *pjVar6->next_input_byte;
        sVar36 = sVar36 - 1;
        if (sVar36 == 0) {
          bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
          if (bVar25 == 0) goto LAB_001231d5;
          pbVar39 = pjVar6->next_input_byte;
          sVar36 = pjVar6->bytes_in_buffer;
        }
        else {
          pbVar39 = pjVar6->next_input_byte + 1;
        }
        bVar2 = *pbVar39;
        uVar40 = (uint)bVar2;
        if (bVar2 != 0xd8 || bVar1 != 0xff) {
          pjVar28 = cinfo->err;
          pjVar28->msg_code = 0x35;
          *(uint *)&pjVar28->msg_parm = (uint)bVar1;
          *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)bVar2;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        cinfo->unread_marker = (uint)bVar2;
        pjVar6->next_input_byte = pbVar39 + 1;
        pjVar6->bytes_in_buffer = sVar36 - 1;
      }
      else {
        bVar25 = next_marker(cinfo);
        if (bVar25 == 0) goto LAB_001231d5;
        uVar40 = cinfo->unread_marker;
      }
    }
    switch(uVar40) {
    case 0xc0:
    case 0xc1:
      is_prog = 0;
      goto LAB_00122524;
    case 0xc2:
      is_prog = 1;
LAB_00122524:
      bVar25 = 0;
LAB_0012267c:
      bVar25 = get_sof(cinfo,is_prog,bVar25);
      if (bVar25 == 0) {
        return 0;
      }
      break;
    case 0xc3:
    case 0xc5:
    case 0xc6:
    case 199:
    case 200:
    case 0xcb:
    case 0xcd:
    case 0xce:
    case 0xcf:
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x3c;
      goto LAB_0012248d;
    case 0xc4:
      pjVar6 = cinfo->src;
      sVar36 = pjVar6->bytes_in_buffer;
      if (sVar36 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_001231d5;
        sVar36 = pjVar6->bytes_in_buffer;
      }
      bVar1 = *pjVar6->next_input_byte;
      sVar36 = sVar36 - 1;
      if (sVar36 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_001231d5;
        pbVar39 = pjVar6->next_input_byte;
        sVar36 = pjVar6->bytes_in_buffer;
      }
      else {
        pbVar39 = pjVar6->next_input_byte + 1;
      }
      uVar34 = (ulong)bVar1 * 0x100;
      sVar36 = sVar36 - 1;
      pbVar35 = pbVar39 + 1;
      lVar43 = uVar34 + *pbVar39 + -2;
      if (0x12 < (uVar34 | *pbVar39)) {
        do {
          if (sVar36 == 0) {
            bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
            if (bVar25 == 0) goto LAB_001231d5;
            pbVar35 = pjVar6->next_input_byte;
            sVar36 = pjVar6->bytes_in_buffer;
          }
          bVar1 = *pbVar35;
          pjVar28 = cinfo->err;
          pjVar28->msg_code = 0x50;
          uVar40 = (uint)bVar1;
          (pjVar28->msg_parm).i[0] = uVar40;
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
          local_178 = 0;
          pbVar35 = pbVar35 + 1;
          sVar36 = sVar36 - 1;
          uVar27 = 0;
          lVar41 = 1;
          do {
            if (sVar36 == 0) {
              bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
              if (bVar25 == 0) goto LAB_001231d5;
              pbVar35 = pjVar6->next_input_byte;
              sVar36 = pjVar6->bytes_in_buffer;
            }
            bVar2 = *pbVar35;
            (&local_178)[lVar41] = bVar2;
            uVar27 = uVar27 + bVar2;
            lVar41 = lVar41 + 1;
            pbVar35 = pbVar35 + 1;
            sVar36 = sVar36 - 1;
          } while (lVar41 != 0x11);
          pjVar28 = cinfo->err;
          auVar11[0xc] = (char)(uStack_177 >> 0x18);
          auVar11._0_12_ = ZEXT712(0);
          auVar23[1] = 0;
          auVar23[0] = (byte)(uStack_177 >> 0x10);
          auVar23._2_3_ = auVar11._10_3_;
          auVar23._5_8_ = 0;
          auVar44[5] = 0;
          auVar44[4] = (byte)(uStack_177 >> 8);
          auVar44._6_7_ = SUB137(auVar23 << 0x40,6);
          auVar44._0_4_ = uStack_177 & 0xff;
          auVar44._13_3_ = 0;
          *(undefined1 (*) [16])&pjVar28->msg_parm = auVar44;
          uVar34 = (ulong)(ushort)_uStack_173 & 0xffffffffffff00ff;
          auVar12._8_4_ = 0;
          auVar12._0_8_ = uVar34;
          auVar12[0xc] = (char)((uint)_uStack_173 >> 0x18);
          auVar13[8] = (char)((uint)_uStack_173 >> 0x10);
          auVar13._0_8_ = uVar34;
          auVar13[9] = 0;
          auVar13._10_3_ = auVar12._10_3_;
          auVar19._5_8_ = 0;
          auVar19._0_5_ = auVar13._8_5_;
          auVar45._0_4_ = (undefined4)uVar34;
          auVar14[4] = (char)((uint)_uStack_173 >> 8);
          auVar14._0_4_ = auVar45._0_4_;
          auVar14[5] = 0;
          auVar14._6_7_ = SUB137(auVar19 << 0x40,6);
          auVar45._4_9_ = auVar14._4_9_;
          auVar45._13_3_ = 0;
          *(undefined1 (*) [16])((long)&pjVar28->msg_parm + 0x10) = auVar45;
          pjVar28->msg_code = 0x56;
          (*pjVar28->emit_message)((j_common_ptr)cinfo,2);
          pjVar28 = cinfo->err;
          auVar15[0xc] = (char)(uStack_16f >> 0x18);
          auVar15._0_12_ = ZEXT712(0);
          auVar24[1] = 0;
          auVar24[0] = (byte)(uStack_16f >> 0x10);
          auVar24._2_3_ = auVar15._10_3_;
          auVar24._5_8_ = 0;
          auVar46[5] = 0;
          auVar46[4] = (byte)(uStack_16f >> 8);
          auVar46._6_7_ = SUB137(auVar24 << 0x40,6);
          auVar46._0_4_ = uStack_16f & 0xff;
          auVar46._13_3_ = 0;
          *(undefined1 (*) [16])&pjVar28->msg_parm = auVar46;
          uVar34 = (ulong)(ushort)_uStack_16b & 0xffffffffffff00ff;
          auVar16._8_4_ = 0;
          auVar16._0_8_ = uVar34;
          auVar16[0xc] = (char)((uint)_uStack_16b >> 0x18);
          auVar17[8] = (char)((uint)_uStack_16b >> 0x10);
          auVar17._0_8_ = uVar34;
          auVar17[9] = 0;
          auVar17._10_3_ = auVar16._10_3_;
          auVar20._5_8_ = 0;
          auVar20._0_5_ = auVar17._8_5_;
          auVar47._0_4_ = (undefined4)uVar34;
          auVar18[4] = (char)((uint)_uStack_16b >> 8);
          auVar18._0_4_ = auVar47._0_4_;
          auVar18[5] = 0;
          auVar18._6_7_ = SUB137(auVar20 << 0x40,6);
          auVar47._4_9_ = auVar18._4_9_;
          auVar47._13_3_ = 0;
          *(undefined1 (*) [16])((long)&pjVar28->msg_parm + 0x10) = auVar47;
          pjVar28->msg_code = 0x56;
          (*pjVar28->emit_message)((j_common_ptr)cinfo,2);
          uVar34 = (ulong)uVar27;
          if ((0x100 < uVar27) || (lVar43 + -0x11 < (long)uVar34)) {
            pjVar28 = cinfo->err;
            pjVar28->msg_code = 8;
            (*pjVar28->error_exit)((j_common_ptr)cinfo);
          }
          if (uVar27 != 0) {
            uVar33 = 0;
            do {
              if (sVar36 == 0) {
                bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
                if (bVar25 == 0) goto LAB_001231d5;
                pbVar35 = pjVar6->next_input_byte;
                sVar36 = pjVar6->bytes_in_buffer;
              }
              sVar36 = sVar36 - 1;
              bVar2 = *pbVar35;
              pbVar35 = pbVar35 + 1;
              local_138[uVar33] = bVar2;
              uVar33 = uVar33 + 1;
            } while (uVar34 != uVar33);
          }
          memset(local_138 + uVar34,0,(long)(int)(0x100 - uVar27));
          if ((bVar1 & 0x10) == 0) {
            ppJVar32 = local_148;
            if (3 < bVar1) {
              pjVar28 = cinfo->err;
              pjVar28->msg_code = 0x1e;
              (pjVar28->msg_parm).i[0] = uVar40;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
              ppJVar32 = local_148;
            }
          }
          else {
            uVar40 = uVar40 - 0x10;
            ppJVar32 = local_140;
            if (0x13 < bVar1) {
              pjVar28 = cinfo->err;
              pjVar28->msg_code = 0x1e;
              (pjVar28->msg_parm).i[0] = uVar40;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
              ppJVar32 = local_140;
            }
          }
          ppJVar32 = ppJVar32 + uVar40;
          pJVar30 = *ppJVar32;
          if (pJVar30 == (JHUFF_TBL *)0x0) {
            pJVar30 = jpeg_alloc_huff_table((j_common_ptr)cinfo);
            *ppJVar32 = pJVar30;
          }
          lVar43 = (lVar43 + -0x11) - uVar34;
          pJVar30->bits[0x10] = UStack_168;
          *(ulong *)pJVar30->bits = CONCAT35(uStack_173,CONCAT41(uStack_177,local_178));
          *(ulong *)(pJVar30->bits + 8) = CONCAT35(uStack_16b,CONCAT41(uStack_16f,uStack_170));
          memcpy((*ppJVar32)->huffval,local_138,0x100);
        } while (0x10 < lVar43);
      }
      if (lVar43 != 0) {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0xb;
        (*pjVar28->error_exit)((j_common_ptr)cinfo);
      }
      pjVar6->next_input_byte = pbVar35;
      pjVar6->bytes_in_buffer = sVar36;
      break;
    case 0xc9:
      is_prog = 0;
      bVar25 = 1;
      goto LAB_0012267c;
    case 0xca:
      iVar26 = get_sof(cinfo,1,1);
      goto LAB_00122476;
    case 0xcc:
      pjVar6 = cinfo->src;
      sVar36 = pjVar6->bytes_in_buffer;
      if (sVar36 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_001231d5;
        sVar36 = pjVar6->bytes_in_buffer;
      }
      bVar1 = *pjVar6->next_input_byte;
      sVar36 = sVar36 - 1;
      if (sVar36 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_001231d5;
        pbVar39 = pjVar6->next_input_byte;
        sVar36 = pjVar6->bytes_in_buffer;
      }
      else {
        pbVar39 = pjVar6->next_input_byte + 1;
      }
      uVar33 = (ulong)bVar1 * 0x100;
      uVar34 = uVar33 | *pbVar39;
      pbVar35 = pbVar39 + 1;
      sVar36 = sVar36 - 1;
      if (uVar34 < 3) {
        lVar43 = uVar33 + *pbVar39 + -2;
      }
      else {
        do {
          uVar33 = uVar34;
          if (sVar36 == 0) {
            bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
            if (bVar25 == 0) goto LAB_001231d5;
            pbVar35 = pjVar6->next_input_byte;
            sVar36 = pjVar6->bytes_in_buffer;
          }
          bVar1 = *pbVar35;
          sVar36 = sVar36 - 1;
          if (sVar36 == 0) {
            bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
            if (bVar25 == 0) goto LAB_001231d5;
            pbVar35 = pjVar6->next_input_byte;
            sVar36 = pjVar6->bytes_in_buffer;
          }
          else {
            pbVar35 = pbVar35 + 1;
          }
          bVar2 = *pbVar35;
          pjVar28 = cinfo->err;
          pjVar28->msg_code = 0x4f;
          uVar40 = (uint)bVar1;
          (pjVar28->msg_parm).i[0] = uVar40;
          (cinfo->err->msg_parm).i[1] = (uint)bVar2;
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
          if (bVar1 < 0x20) {
            if (0xf < bVar1) goto LAB_00122cf4;
            local_150[uVar40] = bVar2 & 0xf;
            local_158[uVar40] = bVar2 >> 4;
            if (bVar2 >> 4 < (bVar2 & 0xf)) {
              pjVar28 = cinfo->err;
              pjVar28->msg_code = 0x1d;
              (pjVar28->msg_parm).i[0] = (uint)bVar2;
              (*cinfo->err->error_exit)((j_common_ptr)cinfo);
            }
          }
          else {
            pjVar28 = cinfo->err;
            pjVar28->msg_code = 0x1c;
            (pjVar28->msg_parm).i[0] = (uint)bVar1;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
LAB_00122cf4:
            cinfo->arith_ac_K[bVar1 - 0x10] = bVar2;
          }
          pbVar35 = pbVar35 + 1;
          sVar36 = sVar36 - 1;
          uVar34 = uVar33 - 2;
        } while (2 < uVar34);
        lVar43 = uVar33 - 4;
      }
      if (lVar43 != 0) {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0xb;
        (*pjVar28->error_exit)((j_common_ptr)cinfo);
      }
      pjVar6->next_input_byte = pbVar35;
      pjVar6->bytes_in_buffer = sVar36;
      break;
    case 0xd0:
    case 0xd1:
    case 0xd2:
    case 0xd3:
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
      goto switchD_0012245e_caseD_d0;
    case 0xd8:
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x66;
      (*pjVar28->emit_message)((j_common_ptr)cinfo,1);
      pjVar29 = cinfo->marker;
      if (pjVar29->saw_SOI != 0) {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0x3d;
        (*pjVar28->error_exit)((j_common_ptr)cinfo);
        pjVar29 = cinfo->marker;
      }
      local_150[0] = '\0';
      local_150[1] = '\0';
      local_150[2] = '\0';
      local_150[3] = '\0';
      local_150[4] = '\0';
      local_150[5] = '\0';
      local_150[6] = '\0';
      local_150[7] = '\0';
      local_150[8] = '\0';
      local_150[9] = '\0';
      local_150[10] = '\0';
      local_150[0xb] = '\0';
      local_150[0xc] = '\0';
      local_150[0xd] = '\0';
      local_150[0xe] = '\0';
      local_150[0xf] = '\0';
      builtin_memcpy(local_158,"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",
                     0x10);
      builtin_memcpy(cinfo->arith_ac_K,
                     "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05",0x10);
      cinfo->restart_interval = 0;
      cinfo->saw_JFIF_marker = 0;
      cinfo->jpeg_color_space = JCS_UNKNOWN;
      cinfo->CCIR601_sampling = 0;
      cinfo->JFIF_major_version = '\x01';
      cinfo->JFIF_minor_version = '\x01';
      cinfo->density_unit = '\0';
      cinfo->X_density = 1;
      cinfo->Y_density = 1;
      cinfo->saw_Adobe_marker = 0;
      cinfo->Adobe_transform = '\0';
      pjVar29->saw_SOI = 1;
      break;
    case 0xd9:
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x55;
      (*pjVar28->emit_message)((j_common_ptr)cinfo,1);
      cinfo->unread_marker = 0;
      return 2;
    case 0xda:
      pjVar6 = cinfo->src;
      pJVar37 = pjVar6->next_input_byte;
      sVar36 = pjVar6->bytes_in_buffer;
      if (cinfo->marker->saw_SOF == 0) {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0x3e;
        (*pjVar28->error_exit)((j_common_ptr)cinfo);
      }
      if (sVar36 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_001231d5;
        pJVar37 = pjVar6->next_input_byte;
        sVar36 = pjVar6->bytes_in_buffer;
      }
      JVar3 = *pJVar37;
      sVar36 = sVar36 - 1;
      if (sVar36 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_001231d5;
        pJVar37 = pjVar6->next_input_byte;
        sVar36 = pjVar6->bytes_in_buffer;
      }
      else {
        pJVar37 = pJVar37 + 1;
      }
      JVar4 = *pJVar37;
      sVar36 = sVar36 - 1;
      if (sVar36 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_001231d5;
        pbVar39 = pjVar6->next_input_byte;
        sVar36 = pjVar6->bytes_in_buffer;
      }
      else {
        pbVar39 = pJVar37 + 1;
      }
      bVar1 = *pbVar39;
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x67;
      (pjVar28->msg_parm).i[0] = (uint)bVar1;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      if ((CONCAT11(JVar3,JVar4) == (ushort)((ushort)bVar1 * 2 + 6)) && (0xfb < (byte)(bVar1 - 5)))
      {
        cinfo->comps_in_scan = (uint)bVar1;
        cinfo->cur_comp_info[0] = (jpeg_component_info *)0x0;
        cinfo->cur_comp_info[1] = (jpeg_component_info *)0x0;
        cinfo->cur_comp_info[2] = (jpeg_component_info *)0x0;
        cinfo->cur_comp_info[3] = (jpeg_component_info *)0x0;
      }
      else {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0xb;
        (*pjVar28->error_exit)((j_common_ptr)cinfo);
        cinfo->comps_in_scan = (uint)bVar1;
        cinfo->cur_comp_info[0] = (jpeg_component_info *)0x0;
        cinfo->cur_comp_info[1] = (jpeg_component_info *)0x0;
        cinfo->cur_comp_info[2] = (jpeg_component_info *)0x0;
        cinfo->cur_comp_info[3] = (jpeg_component_info *)0x0;
        pbVar35 = pbVar39 + 1;
        local_198 = sVar36 - 1;
        if (bVar1 == 0) goto LAB_001230d5;
      }
      local_198 = sVar36 - 1;
      pbVar35 = pbVar39 + 1;
      uVar34 = 0;
      goto LAB_00122f97;
    case 0xdb:
      pjVar6 = cinfo->src;
      sVar36 = pjVar6->bytes_in_buffer;
      if (sVar36 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_001231d5;
        sVar36 = pjVar6->bytes_in_buffer;
      }
      bVar1 = *pjVar6->next_input_byte;
      sVar36 = sVar36 - 1;
      if (sVar36 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_001231d5;
        pbVar39 = pjVar6->next_input_byte;
        sVar36 = pjVar6->bytes_in_buffer;
      }
      else {
        pbVar39 = pjVar6->next_input_byte + 1;
      }
      uVar34 = (ulong)bVar1 * 0x100;
      sVar36 = sVar36 - 1;
      pbVar35 = pbVar39 + 1;
      lVar43 = uVar34 + *pbVar39 + -2;
      if (2 < (uVar34 | *pbVar39)) {
        do {
          if (sVar36 == 0) {
            bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
            if (bVar25 == 0) goto LAB_001231d5;
            pbVar35 = pjVar6->next_input_byte;
            sVar36 = pjVar6->bytes_in_buffer;
          }
          bVar1 = *pbVar35;
          uVar40 = bVar1 & 0xf;
          pjVar28 = cinfo->err;
          pjVar28->msg_code = 0x51;
          (pjVar28->msg_parm).i[0] = uVar40;
          *(uint *)((long)&cinfo->err->msg_parm + 4) = (uint)(bVar1 >> 4);
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
          if (3 < uVar40) {
            pjVar28 = cinfo->err;
            pjVar28->msg_code = 0x1f;
            (pjVar28->msg_parm).i[0] = uVar40;
            (*cinfo->err->error_exit)((j_common_ptr)cinfo);
          }
          pJVar31 = cinfo->quant_tbl_ptrs[uVar40];
          if (pJVar31 == (JQUANT_TBL *)0x0) {
            pJVar31 = jpeg_alloc_quant_table((j_common_ptr)cinfo);
            cinfo->quant_tbl_ptrs[uVar40] = pJVar31;
          }
          sVar36 = sVar36 - 1;
          pbVar35 = pbVar35 + 1;
          lVar41 = 0;
          do {
            if (bVar1 < 0x10) {
              if (sVar36 == 0) {
                bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
                if (bVar25 == 0) goto LAB_001231d5;
                pbVar35 = pjVar6->next_input_byte;
                sVar36 = pjVar6->bytes_in_buffer;
              }
              UVar38 = (UINT16)*pbVar35;
            }
            else {
              if (sVar36 == 0) {
                bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
                if (bVar25 == 0) goto LAB_001231d5;
                pbVar35 = pjVar6->next_input_byte;
                sVar36 = pjVar6->bytes_in_buffer;
              }
              bVar2 = *pbVar35;
              sVar36 = sVar36 - 1;
              if (sVar36 == 0) {
                bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
                if (bVar25 == 0) goto LAB_001231d5;
                pbVar35 = pjVar6->next_input_byte;
                sVar36 = pjVar6->bytes_in_buffer;
              }
              else {
                pbVar35 = pbVar35 + 1;
              }
              UVar38 = CONCAT11(bVar2,*pbVar35);
            }
            pJVar31->quantval[jpeg_natural_order[lVar41]] = UVar38;
            lVar41 = lVar41 + 1;
            sVar36 = sVar36 - 1;
            pbVar35 = pbVar35 + 1;
          } while (lVar41 != 0x40);
          if (1 < cinfo->err->trace_level) {
            uVar34 = 0xfffffffffffffff8;
            do {
              pjVar28 = cinfo->err;
              uVar33 = *(ulong *)(pJVar31->quantval + uVar34 + 8);
              auVar8._8_4_ = 0;
              auVar8._0_8_ = uVar33;
              auVar8._12_2_ = (short)(uVar33 >> 0x30);
              auVar10._8_2_ = (short)(uVar33 >> 0x20);
              auVar10._0_8_ = uVar33;
              auVar10._10_4_ = auVar8._10_4_;
              auVar21._6_8_ = 0;
              auVar21._0_6_ = auVar10._8_6_;
              auVar48._6_8_ = SUB148(auVar21 << 0x40,6);
              auVar48._4_2_ = (short)(uVar33 >> 0x10);
              auVar48._0_2_ = (ushort)uVar33;
              auVar48._2_2_ = 0;
              auVar48._14_2_ = 0;
              *(undefined1 (*) [16])&pjVar28->msg_parm = auVar48;
              uVar33 = *(ulong *)(pJVar31->quantval + uVar34 + 0xc);
              auVar7._8_4_ = 0;
              auVar7._0_8_ = uVar33;
              auVar7._12_2_ = (short)(uVar33 >> 0x30);
              auVar9._8_2_ = (short)(uVar33 >> 0x20);
              auVar9._0_8_ = uVar33;
              auVar9._10_4_ = auVar7._10_4_;
              auVar22._6_8_ = 0;
              auVar22._0_6_ = auVar9._8_6_;
              auVar49._6_8_ = SUB148(auVar22 << 0x40,6);
              auVar49._4_2_ = (short)(uVar33 >> 0x10);
              auVar49._0_2_ = (ushort)uVar33;
              auVar49._2_2_ = 0;
              auVar49._14_2_ = 0;
              *(undefined1 (*) [16])((long)&pjVar28->msg_parm + 0x10) = auVar49;
              pjVar28->msg_code = 0x5d;
              (*pjVar28->emit_message)((j_common_ptr)cinfo,2);
              uVar34 = uVar34 + 8;
            } while (uVar34 < 0x38);
          }
          lVar43 = lVar43 + (ulong)(bVar1 < 0x10) * 0x40 + -0x81;
        } while (0 < lVar43);
      }
      if (lVar43 != 0) {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0xb;
        (*pjVar28->error_exit)((j_common_ptr)cinfo);
      }
      pjVar6->next_input_byte = pbVar35;
      pjVar6->bytes_in_buffer = sVar36;
      break;
    case 0xdc:
      iVar26 = skip_variable(cinfo);
      goto LAB_00122476;
    case 0xdd:
      pjVar6 = cinfo->src;
      sVar36 = pjVar6->bytes_in_buffer;
      if (sVar36 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_001231d5;
        sVar36 = pjVar6->bytes_in_buffer;
      }
      JVar3 = *pjVar6->next_input_byte;
      sVar36 = sVar36 - 1;
      if (sVar36 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_001231d5;
        pJVar37 = pjVar6->next_input_byte;
        sVar36 = pjVar6->bytes_in_buffer;
      }
      else {
        pJVar37 = pjVar6->next_input_byte + 1;
      }
      if (CONCAT11(JVar3,*pJVar37) != 4) {
        pjVar28 = cinfo->err;
        pjVar28->msg_code = 0xb;
        (*pjVar28->error_exit)((j_common_ptr)cinfo);
      }
      sVar36 = sVar36 - 1;
      if (sVar36 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_001231d5;
        pJVar37 = pjVar6->next_input_byte;
        sVar36 = pjVar6->bytes_in_buffer;
      }
      else {
        pJVar37 = pJVar37 + 1;
      }
      JVar3 = *pJVar37;
      sVar36 = sVar36 - 1;
      if (sVar36 == 0) {
        bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
        if (bVar25 == 0) goto LAB_001231d5;
        pJVar37 = pjVar6->next_input_byte;
        sVar36 = pjVar6->bytes_in_buffer;
      }
      else {
        pJVar37 = pJVar37 + 1;
      }
      JVar4 = *pJVar37;
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x52;
      (pjVar28->msg_parm).i[0] = (uint)CONCAT11(JVar3,JVar4);
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
      cinfo->restart_interval = (uint)CONCAT11(JVar3,JVar4);
      pjVar6->next_input_byte = pJVar37 + 1;
      pjVar6->bytes_in_buffer = sVar36 - 1;
      break;
    case 0xde:
    case 0xdf:
    case 0xf0:
    case 0xf1:
    case 0xf2:
    case 0xf3:
    case 0xf4:
    case 0xf5:
    case 0xf6:
    case 0xf7:
    case 0xf8:
    case 0xf9:
    case 0xfa:
    case 0xfb:
    case 0xfc:
    case 0xfd:
switchD_0012245e_caseD_de:
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x44;
LAB_0012248d:
      (pjVar28->msg_parm).i[0] = uVar40;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      break;
    case 0xe0:
    case 0xe1:
    case 0xe2:
    case 0xe3:
    case 0xe4:
    case 0xe5:
    case 0xe6:
    case 0xe7:
    case 0xe8:
    case 0xe9:
    case 0xea:
    case 0xeb:
    case 0xec:
    case 0xed:
    case 0xee:
    case 0xef:
      iVar26 = (*(&cinfo->marker[1].read_markers)[uVar40 - 0xe0])(cinfo);
      goto LAB_00122476;
    case 0xfe:
      iVar26 = (*cinfo->marker[1].reset_marker_reader)(cinfo);
LAB_00122476:
      if (iVar26 == 0) goto LAB_001231d5;
      break;
    default:
      if (uVar40 != 1) goto switchD_0012245e_caseD_de;
switchD_0012245e_caseD_d0:
      pjVar28 = cinfo->err;
      pjVar28->msg_code = 0x5c;
      (pjVar28->msg_parm).i[0] = uVar40;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,1);
    }
    cinfo->unread_marker = 0;
    uVar40 = 0;
  } while( true );
LAB_00122f97:
  do {
    if (local_198 == 0) {
      bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar25 == 0) goto LAB_001231d5;
      pbVar35 = pjVar6->next_input_byte;
      local_198 = pjVar6->bytes_in_buffer;
    }
    bVar2 = *pbVar35;
    local_198 = local_198 - 1;
    if (local_198 == 0) {
      bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar25 == 0) goto LAB_001231d5;
      pbVar35 = pjVar6->next_input_byte;
      local_198 = pjVar6->bytes_in_buffer;
    }
    else {
      pbVar35 = pbVar35 + 1;
    }
    bVar5 = *pbVar35;
    pjVar42 = cinfo->comp_info;
    uVar40 = (uint)bVar2;
    if (0 < cinfo->num_components) {
      uVar27 = cinfo->num_components - 1;
      if (2 < uVar27) {
        uVar27 = 3;
      }
      uVar33 = 0;
      do {
        if ((pjVar42->component_id == uVar40) &&
           (cinfo->cur_comp_info[uVar33] == (jpeg_component_info *)0x0)) goto LAB_0012303b;
        uVar33 = uVar33 + 1;
        pjVar42 = pjVar42 + 1;
      } while (uVar27 + 1 != uVar33);
    }
    pjVar28 = cinfo->err;
    pjVar28->msg_code = 5;
    (pjVar28->msg_parm).i[0] = uVar40;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
LAB_0012303b:
    cinfo->cur_comp_info[uVar34] = pjVar42;
    pjVar42->dc_tbl_no = (uint)(bVar5 >> 4);
    pjVar42->ac_tbl_no = bVar5 & 0xf;
    pjVar28 = cinfo->err;
    (pjVar28->msg_parm).i[0] = uVar40;
    (pjVar28->msg_parm).i[1] = pjVar42->dc_tbl_no;
    (pjVar28->msg_parm).i[2] = pjVar42->ac_tbl_no;
    pjVar28->msg_code = 0x68;
    (*pjVar28->emit_message)((j_common_ptr)cinfo,1);
    if (uVar34 != 0) {
      uVar33 = 0;
      do {
        if (cinfo->cur_comp_info[uVar33] == pjVar42) {
          pjVar28 = cinfo->err;
          pjVar28->msg_code = 5;
          (pjVar28->msg_parm).i[0] = uVar40;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        uVar33 = uVar33 + 1;
      } while (uVar34 != uVar33);
    }
    uVar34 = uVar34 + 1;
    pbVar35 = pbVar35 + 1;
    local_198 = local_198 - 1;
  } while (uVar34 != bVar1);
LAB_001230d5:
  if (local_198 == 0) {
    bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
    if (bVar25 != 0) {
      pbVar35 = pjVar6->next_input_byte;
      local_198 = pjVar6->bytes_in_buffer;
      goto LAB_001230f3;
    }
LAB_001231d5:
    iVar26 = 0;
  }
  else {
LAB_001230f3:
    cinfo->Ss = (uint)*pbVar35;
    local_198 = local_198 - 1;
    if (local_198 == 0) {
      bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar25 == 0) goto LAB_001231d5;
      pbVar35 = pjVar6->next_input_byte;
      local_198 = pjVar6->bytes_in_buffer;
    }
    else {
      pbVar35 = pbVar35 + 1;
    }
    cinfo->Se = (uint)*pbVar35;
    local_198 = local_198 - 1;
    if (local_198 == 0) {
      bVar25 = (*pjVar6->fill_input_buffer)(cinfo);
      if (bVar25 == 0) goto LAB_001231d5;
      pbVar35 = pjVar6->next_input_byte;
      local_198 = pjVar6->bytes_in_buffer;
    }
    else {
      pbVar35 = pbVar35 + 1;
    }
    bVar1 = *pbVar35;
    cinfo->Ah = (uint)(bVar1 >> 4);
    cinfo->Al = bVar1 & 0xf;
    pjVar28 = cinfo->err;
    (pjVar28->msg_parm).i[0] = cinfo->Ss;
    (pjVar28->msg_parm).i[1] = cinfo->Se;
    (pjVar28->msg_parm).i[2] = cinfo->Ah;
    (pjVar28->msg_parm).i[3] = cinfo->Al;
    pjVar28->msg_code = 0x69;
    iVar26 = 1;
    (*pjVar28->emit_message)((j_common_ptr)cinfo,1);
    cinfo->marker->next_restart_num = 0;
    cinfo->input_scan_number = cinfo->input_scan_number + 1;
    pjVar6->next_input_byte = pbVar35 + 1;
    pjVar6->bytes_in_buffer = local_198 - 1;
    cinfo->unread_marker = 0;
  }
  return iVar26;
}

Assistant:

METHODDEF(int)
read_markers(j_decompress_ptr cinfo)
{
  /* Outer loop repeats once for each marker. */
  for (;;) {
    /* Collect the marker proper, unless we already did. */
    /* NB: first_marker() enforces the requirement that SOI appear first. */
    if (cinfo->unread_marker == 0) {
      if (!cinfo->marker->saw_SOI) {
        if (!first_marker(cinfo))
          return JPEG_SUSPENDED;
      } else {
        if (!next_marker(cinfo))
          return JPEG_SUSPENDED;
      }
    }
    /* At this point cinfo->unread_marker contains the marker code and the
     * input point is just past the marker proper, but before any parameters.
     * A suspension will cause us to return with this state still true.
     */
    switch (cinfo->unread_marker) {
    case M_SOI:
      if (!get_soi(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_SOF0:                /* Baseline */
    case M_SOF1:                /* Extended sequential, Huffman */
      if (!get_sof(cinfo, FALSE, FALSE))
        return JPEG_SUSPENDED;
      break;

    case M_SOF2:                /* Progressive, Huffman */
      if (!get_sof(cinfo, TRUE, FALSE))
        return JPEG_SUSPENDED;
      break;

    case M_SOF9:                /* Extended sequential, arithmetic */
      if (!get_sof(cinfo, FALSE, TRUE))
        return JPEG_SUSPENDED;
      break;

    case M_SOF10:               /* Progressive, arithmetic */
      if (!get_sof(cinfo, TRUE, TRUE))
        return JPEG_SUSPENDED;
      break;

    /* Currently unsupported SOFn types */
    case M_SOF3:                /* Lossless, Huffman */
    case M_SOF5:                /* Differential sequential, Huffman */
    case M_SOF6:                /* Differential progressive, Huffman */
    case M_SOF7:                /* Differential lossless, Huffman */
    case M_JPG:                 /* Reserved for JPEG extensions */
    case M_SOF11:               /* Lossless, arithmetic */
    case M_SOF13:               /* Differential sequential, arithmetic */
    case M_SOF14:               /* Differential progressive, arithmetic */
    case M_SOF15:               /* Differential lossless, arithmetic */
      ERREXIT1(cinfo, JERR_SOF_UNSUPPORTED, cinfo->unread_marker);
      break;

    case M_SOS:
      if (!get_sos(cinfo))
        return JPEG_SUSPENDED;
      cinfo->unread_marker = 0; /* processed the marker */
      return JPEG_REACHED_SOS;

    case M_EOI:
      TRACEMS(cinfo, 1, JTRC_EOI);
      cinfo->unread_marker = 0; /* processed the marker */
      return JPEG_REACHED_EOI;

    case M_DAC:
      if (!get_dac(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_DHT:
      if (!get_dht(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_DQT:
      if (!get_dqt(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_DRI:
      if (!get_dri(cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_APP0:
    case M_APP1:
    case M_APP2:
    case M_APP3:
    case M_APP4:
    case M_APP5:
    case M_APP6:
    case M_APP7:
    case M_APP8:
    case M_APP9:
    case M_APP10:
    case M_APP11:
    case M_APP12:
    case M_APP13:
    case M_APP14:
    case M_APP15:
      if (!(*((my_marker_ptr)cinfo->marker)->process_APPn[
               cinfo->unread_marker - (int)M_APP0]) (cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_COM:
      if (!(*((my_marker_ptr)cinfo->marker)->process_COM) (cinfo))
        return JPEG_SUSPENDED;
      break;

    case M_RST0:                /* these are all parameterless */
    case M_RST1:
    case M_RST2:
    case M_RST3:
    case M_RST4:
    case M_RST5:
    case M_RST6:
    case M_RST7:
    case M_TEM:
      TRACEMS1(cinfo, 1, JTRC_PARMLESS_MARKER, cinfo->unread_marker);
      break;

    case M_DNL:                 /* Ignore DNL ... perhaps the wrong thing */
      if (!skip_variable(cinfo))
        return JPEG_SUSPENDED;
      break;

    default:                    /* must be DHP, EXP, JPGn, or RESn */
      /* For now, we treat the reserved markers as fatal errors since they are
       * likely to be used to signal incompatible JPEG Part 3 extensions.
       * Once the JPEG 3 version-number marker is well defined, this code
       * ought to change!
       */
      ERREXIT1(cinfo, JERR_UNKNOWN_MARKER, cinfo->unread_marker);
      break;
    }
    /* Successfully processed marker, so reset state variable */
    cinfo->unread_marker = 0;
  } /* end loop */
}